

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_type jVar1;
  long lVar2;
  double dVar3;
  ushort uVar4;
  bool bVar5;
  uchar uVar6;
  byte bVar7;
  uchar uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ushort **ppuVar12;
  long lVar13;
  anon_union_8_2_291a86ad_for__reserved *paVar14;
  long lVar15;
  char *pcVar16;
  byte *pbVar17;
  ulong uVar18;
  _json_value *p_Var19;
  uint uVar20;
  json_value *pjVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  long in_FS_OFFSET;
  ulong uStack_1b0;
  _json_value *local_198;
  long local_188;
  long local_170;
  long local_168;
  json_state local_138;
  json_value *local_d0;
  json_value *root;
  json_value *local_c0;
  char error [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  error._0_8_ = error._0_8_ & 0xffffffffffffff00;
  local_138.settings.max_memory = settings->max_memory;
  local_138.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_138.settings.mem_alloc = settings->mem_alloc;
  local_138.settings.mem_free = settings->mem_free;
  local_138.settings.user_data = settings->user_data;
  local_138.settings.value_extra = settings->value_extra;
  if (local_138.settings.mem_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_138.settings.mem_alloc = default_alloc;
  }
  pbVar17 = (byte *)json + length;
  if (local_138.settings.mem_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_138.settings.mem_free = default_free;
  }
  local_d0 = (json_value *)0x0;
  local_138.ulong_max = 0xfffffffffffffff7;
  local_138.uint_max = 0xfffffff7;
  local_138._12_4_ = 0;
  local_138.used_memory = 0;
  local_168 = 0;
  local_170 = 0;
  local_188 = 0;
  uVar23 = 8;
  bVar5 = false;
  local_138.first_pass = 1;
  local_138._76_4_ = 0;
  root = (json_value *)0x0;
  local_c0 = (json_value *)0x0;
  local_138.cur_line = 1;
  local_138.cur_col = 0;
  local_198 = (_json_value *)0x0;
  uVar22 = 0;
  do {
    pjVar21 = local_c0;
    local_138.ptr = json;
    if ((byte *)json == pbVar17) {
      if ((uVar23 & 0x20) == 0) {
        uVar20 = 0;
        goto LAB_0011da17;
      }
LAB_0011e884:
      uStack_1b0 = local_138._88_8_ & 0xffffffff;
      uVar18 = (ulong)local_138.cur_col;
      pcVar16 = "Unexpected EOF in string (at %d:%d)";
      goto LAB_0011e8bf;
    }
    bVar7 = *json;
    uVar20 = (uint)bVar7;
    if ((uVar23 & 0x20) != 0) {
      if (bVar7 == 0) goto LAB_0011e884;
      if (uVar22 <= local_138.uint_max) {
        uVar18 = (ulong)uVar22;
        if ((uVar23 & 0x10) == 0) {
          if (bVar7 == 0x22) {
            if (local_138.first_pass == 0) {
              *(undefined1 *)((long)&local_198->parent + uVar18) = 0;
            }
            uVar23 = uVar23 & 0xffffffcf;
            if (local_c0->type != json_object) {
              uVar20 = 0x22;
              if (local_c0->type == json_string) {
                (local_c0->u).string.length = uVar22;
                bVar5 = true;
              }
              local_198 = (_json_value *)0x0;
              goto LAB_0011da17;
            }
            if (local_138.first_pass == 0) {
              *(anon_union_8_2_291a86ad_for__reserved *)
               ((local_c0->u).string.ptr + (ulong)(local_c0->u).string.length * 0x18) =
                   local_c0->_reserved;
              paVar14 = &local_c0->_reserved;
              (local_c0->u).object.values[(local_c0->u).string.length].name_length = uVar22;
            }
            else {
              paVar14 = (anon_union_8_2_291a86ad_for__reserved *)&(local_c0->u).object.values;
            }
            paVar14->next_alloc =
                 (_json_value *)((long)&paVar14->next_alloc->parent + (ulong)(uVar22 + 1));
            uVar23 = uVar23 | 0x48;
            local_198 = (_json_value *)0x0;
          }
          else {
            if (bVar7 != 0x5c) goto switchD_0011db54_caseD_6f;
            uVar23 = uVar23 | 0x10;
          }
        }
        else {
          uVar23 = uVar23 & 0xffffffef;
          switch(bVar7) {
          case 0x6e:
            if (local_138.first_pass == 0) {
              *(undefined1 *)((long)&local_198->parent + uVar18) = 10;
            }
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_0011db54_caseD_6f:
            if (local_138.first_pass == 0) {
              *(byte *)((long)&local_198->parent + uVar18) = bVar7;
            }
            break;
          case 0x72:
            if (local_138.first_pass == 0) {
              *(undefined1 *)((long)&local_198->parent + uVar18) = 0xd;
            }
            break;
          case 0x74:
            if (local_138.first_pass == 0) {
              *(undefined1 *)((long)&local_198->parent + uVar18) = 9;
            }
            break;
          case 0x75:
            if (4 < (long)pbVar17 - (long)json) {
              local_138.ptr = (char *)((byte *)json + 1);
              uVar6 = hex_value(((byte *)json)[1]);
              if (uVar6 != 0xff) {
                local_138.ptr = (char *)((byte *)json + 2);
                bVar7 = hex_value(((byte *)json)[2]);
                if (bVar7 != 0xff) {
                  local_138.ptr = (char *)((byte *)json + 3);
                  uVar8 = hex_value(((byte *)json)[3]);
                  if (uVar8 != 0xff) {
                    local_138.ptr = (char *)((byte *)json + 4);
                    bVar9 = hex_value(((byte *)json)[4]);
                    if (bVar9 != 0xff) {
                      bVar25 = uVar6 << 4 | bVar7;
                      bVar9 = bVar9 | uVar8 << 4;
                      uVar4 = CONCAT11(bVar25,bVar9);
                      if ((byte)(uVar6 << 4 | bVar7 & 0xf8) != 0xd8) {
                        if (uVar4 < 0x80) {
                          if (local_138.first_pass == 0) {
                            *(byte *)((long)&local_198->parent + uVar18) = bVar9;
                          }
                          break;
                        }
                        if (bVar25 < 8) {
                          if (local_138.first_pass == 0) {
                            uVar20 = uVar22 + 1;
                            *(byte *)((long)&local_198->parent + uVar18) = (byte)(uVar4 >> 6) | 0xc0
                            ;
                            uVar22 = uVar22 + 2;
                            *(byte *)((long)&local_198->parent + (ulong)uVar20) =
                                 bVar9 & 0x3f | 0x80;
                          }
                          else {
                            uVar22 = uVar22 + 2;
                          }
                        }
                        else if (local_138.first_pass == 0) {
                          *(byte *)((long)&local_198->parent + uVar18) = bVar25 >> 4 | 0xe0;
                          uVar20 = uVar22 + 2;
                          *(byte *)((long)&local_198->parent + (ulong)(uVar22 + 1)) =
                               (byte)(uVar4 >> 6) & 0x3f | 0x80;
                          uVar22 = uVar22 + 3;
                          *(byte *)((long)&local_198->parent + (ulong)uVar20) = bVar9 & 0x3f | 0x80;
                        }
                        else {
                          uVar22 = uVar22 + 3;
                        }
                        goto LAB_0011e124;
                      }
                      if (((6 < (long)pbVar17 - (long)((byte *)json + 4)) &&
                          (local_138.ptr = (char *)((byte *)json + 5), ((byte *)json)[5] == 0x5c))
                         && (local_138.ptr = (char *)((byte *)json + 6), ((byte *)json)[6] == 0x75))
                      {
                        local_138.ptr = (char *)((byte *)json + 7);
                        uVar6 = hex_value(((byte *)json)[7]);
                        if (uVar6 != 0xff) {
                          local_138.ptr = (char *)((byte *)json + 8);
                          bVar25 = hex_value(((byte *)json)[8]);
                          if (bVar25 != 0xff) {
                            local_138.ptr = (char *)((byte *)json + 9);
                            uVar6 = hex_value(((byte *)json)[9]);
                            if (uVar6 != 0xff) {
                              local_138.ptr = (char *)((byte *)json + 10);
                              bVar10 = hex_value(((byte *)json)[10]);
                              if (bVar10 != 0xff) {
                                if (local_138.first_pass == 0) {
                                  bVar10 = bVar10 | uVar6 << 4;
                                  *(byte *)((long)&local_198->parent + uVar18) = bVar7 & 3 | 0xf0;
                                  *(byte *)((long)&local_198->parent + (ulong)(uVar22 + 1)) =
                                       bVar9 >> 2 | 0x90;
                                  *(byte *)((long)&local_198->parent + (ulong)(uVar22 + 2)) =
                                       (byte)(((bVar25 & 3) << 8 | (uint)bVar10 | (uint)uVar4 << 10)
                                             >> 6) & 0x3f | 0x80;
                                  *(byte *)((long)&local_198->parent + (ulong)(uVar22 + 3)) =
                                       bVar10 & 0x3f | 0x80;
                                }
                                uVar22 = uVar22 + 4;
                                goto LAB_0011e124;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            uVar18 = local_138._88_8_ & 0xffffffff;
            pcVar16 = "Invalid character value `%c` (at %d:%d)";
            uStack_1b0 = 0x75;
            goto LAB_0011e8bf;
          default:
            if (bVar7 == 0x66) {
              if (local_138.first_pass == 0) {
                *(undefined1 *)((long)&local_198->parent + uVar18) = 0xc;
              }
            }
            else {
              if (bVar7 != 0x62) goto switchD_0011db54_caseD_6f;
              if (local_138.first_pass == 0) {
                *(undefined1 *)((long)&local_198->parent + uVar18) = 8;
              }
            }
          }
          uVar22 = uVar22 + 1;
        }
        goto LAB_0011e124;
      }
LAB_0011e89d:
      uStack_1b0 = local_138._88_8_ & 0xffffffff;
      uVar18 = (ulong)local_138._88_8_ >> 0x20;
      pcVar16 = "%d:%d: Too long (caught overflow)";
LAB_0011e8bf:
      __sprintf_chk(error,1,0x80,pcVar16,uStack_1b0,uVar18);
      goto LAB_0011e8cb;
    }
LAB_0011da17:
    bVar7 = (byte)uVar20;
    if ((local_138.settings._8_8_ & 1) != 0) {
      if ((uVar23 & 0x6000) != 0) {
        if ((uVar23 >> 0xd & 1) == 0) {
          if ((uVar23 >> 0xe & 1) == 0) goto LAB_0011da29;
          if (bVar7 == 0x2a) {
            if ((json < pbVar17 + -1) && (((byte *)json)[1] == 0x2f)) {
              local_138.ptr = (char *)((byte *)json + 1);
              uVar23 = uVar23 & 0xffff9fff;
            }
          }
          else if (uVar20 == 0) {
            uStack_1b0 = local_138._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_138.cur_col;
            pcVar16 = "%d:%d: Unexpected EOF in block comment";
            goto LAB_0011e8bf;
          }
        }
        else if ((bVar7 < 0xe) && ((0x2401U >> (uVar20 & 0x1f) & 1) != 0)) {
          uVar23 = uVar23 & 0xffffdfff;
          local_138.ptr = (char *)((byte *)json + -1);
        }
        goto LAB_0011e124;
      }
      if (bVar7 != 0x2f) goto LAB_0011da29;
      if (((uVar23 & 0x88) == 0) && (local_c0->type != json_object)) {
        uStack_1b0 = local_138._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_138.cur_col;
        pcVar16 = "%d:%d: Comment not allowed here";
      }
      else {
        local_138.ptr = (char *)((byte *)json + 1);
        if ((byte *)local_138.ptr != pbVar17) {
          if (*local_138.ptr == 0x2a) {
            uVar23 = uVar23 | 0x4000;
          }
          else {
            if (*local_138.ptr != 0x2f) {
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Unexpected `%c` in comment opening sequence";
              goto LAB_0011e8bf;
            }
            uVar23 = uVar23 | 0x2000;
          }
          goto LAB_0011e124;
        }
        uStack_1b0 = local_138._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_138.cur_col;
        pcVar16 = "%d:%d: EOF unexpected";
      }
      goto LAB_0011e8bf;
    }
LAB_0011da29:
    if ((uVar23 & 8) == 0) {
      jVar1 = local_c0->type;
      uVar24 = uVar23;
      if (jVar1 - json_integer < 2) {
        ppuVar12 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar12 + (long)(char)bVar7 * 2 + 1) & 8) != 0) {
          lVar13 = local_188 + 1;
          lVar15 = (long)(int)(char)bVar7;
          if ((jVar1 == json_integer) || ((uVar23 & 0x400) != 0)) {
            if ((uVar23 >> 10 & 1) == 0) {
              if ((uVar23 >> 9 & 1) != 0) {
                uStack_1b0 = local_138._88_8_ & 0xffffffff;
                uVar18 = (ulong)local_138.cur_col;
                pcVar16 = "%d:%d: Unexpected `0` before `%c`";
                goto LAB_0011e8bf;
              }
              uVar20 = uVar23 | 0x200;
              if (bVar7 != 0x30) {
                uVar20 = uVar23;
              }
              if (local_188 == 0) {
                uVar23 = uVar20;
              }
              (pjVar21->u).integer = lVar15 + (pjVar21->u).integer * 10 + -0x30;
              local_188 = lVar13;
            }
            else {
              uVar23 = uVar23 | 0x800;
              local_170 = lVar15 + local_170 * 10 + -0x30;
              local_188 = lVar13;
            }
          }
          else {
            local_168 = lVar15 + local_168 * 10 + -0x30;
            local_188 = lVar13;
          }
          goto LAB_0011e124;
        }
        if (bVar7 == 0x2b) {
LAB_0011daa2:
          if ((uVar23 & 0xc00) == 0x400) {
            uVar23 = (uint)(bVar7 == 0x2d) << 0xc | uVar23 | 0x800;
            goto LAB_0011e124;
          }
LAB_0011e0ce:
          if ((uVar23 >> 10 & 1) != 0) goto LAB_0011e2c9;
          if (jVar1 == json_double) {
LAB_0011e23d:
            if (local_188 == 0) {
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Expected digit after `.`";
              goto LAB_0011e8bf;
            }
            dVar3 = pow(10.0,(double)local_188);
            (pjVar21->u).dbl = (double)local_168 / dVar3 + (pjVar21->u).dbl;
          }
          if ((bVar7 & 0xdf) == 0x45) {
            if (pjVar21->type == json_integer) {
              pjVar21->type = json_double;
              (pjVar21->u).dbl = (double)(pjVar21->u).integer;
            }
            uVar23 = uVar23 & 0xfffff977 | 0x400;
LAB_0011e2bb:
            local_188 = 0;
            goto LAB_0011e124;
          }
        }
        else {
          if (uVar20 != 0x2e) {
            if (uVar20 == 0x2d) goto LAB_0011daa2;
            goto LAB_0011e0ce;
          }
          if (jVar1 == json_integer) {
            if (local_188 == 0) {
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Expected digit before `.`";
              goto LAB_0011e8bf;
            }
            pjVar21->type = json_double;
            (pjVar21->u).dbl = (double)(pjVar21->u).integer;
            goto LAB_0011e2bb;
          }
          if ((uVar23 >> 10 & 1) == 0) goto LAB_0011e23d;
LAB_0011e2c9:
          if (local_188 == 0) {
            uStack_1b0 = local_138._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_138.cur_col;
            pcVar16 = "%d:%d: Expected digit after `e`";
            goto LAB_0011e8bf;
          }
          lVar13 = -local_170;
          if ((uVar23 >> 0xc & 1) == 0) {
            lVar13 = local_170;
          }
          dVar3 = pow(10.0,(double)lVar13);
          (pjVar21->u).dbl = dVar3 * (pjVar21->u).dbl;
        }
        if ((uVar23 >> 8 & 1) != 0) {
          if (pjVar21->type == json_integer) {
            (pjVar21->u).integer = -(pjVar21->u).integer;
          }
          else {
            (pjVar21->u).integer = (pjVar21->u).integer ^ 0x8000000000000000;
          }
        }
LAB_0011e339:
        bVar5 = true;
        uVar24 = uVar24 | 3;
      }
      else {
        if (jVar1 != json_object) goto LAB_0011e33d;
        if (bVar7 == 9) goto LAB_0011e124;
        if (uVar20 == 0x7d) goto LAB_0011dfa3;
        if ((uVar20 == 0xd) || (uVar20 == 0x20)) goto LAB_0011e124;
        if (uVar20 != 0x22) {
          if (uVar20 == 0x2c) {
            if ((uVar23 & 4) != 0) {
              uVar24 = uVar23 & 0xffffff73;
              goto LAB_0011e33d;
            }
          }
          else if (uVar20 == 10) goto LAB_0011dc02;
          uStack_1b0 = local_138._88_8_ & 0xffffffff;
          uVar18 = (ulong)local_138.cur_col;
          pcVar16 = "%d:%d: Unexpected `%c` in object";
          goto LAB_0011e8bf;
        }
        if ((uVar23 & 4) != 0) {
          uStack_1b0 = local_138._88_8_ & 0xffffffff;
          uVar18 = (ulong)local_138.cur_col;
          pcVar16 = "%d:%d: Expected , before \"";
          goto LAB_0011e8bf;
        }
        uVar24 = uVar23 | 0x20;
        local_198 = (local_c0->_reserved).next_alloc;
        uVar22 = 0;
      }
LAB_0011e33d:
      uVar23 = uVar24;
      if ((uVar24 & 2) != 0) {
        uVar23 = uVar24 & 0xfffffffd;
        local_138.ptr = local_138.ptr + -1;
      }
      if (bVar5) {
        p_Var19 = local_c0->parent;
        if (p_Var19 == (_json_value *)0x0) {
          uVar23 = uVar23 & 0xfffffffa | 0x84;
          bVar5 = false;
        }
        else {
          jVar1 = p_Var19->type;
          if (local_138.first_pass == 0) {
            if (jVar1 == json_array) {
              *(json_value **)((p_Var19->u).string.ptr + (ulong)(p_Var19->u).string.length * 8) =
                   local_c0;
              p_Var19 = local_c0->parent;
            }
            else if (jVar1 == json_object) {
              (p_Var19->u).object.values[(p_Var19->u).string.length].value = local_c0;
            }
          }
          uVar20 = (p_Var19->u).boolean + 1;
          (p_Var19->u).string.length = uVar20;
          if (local_138.uint_max < uVar20) goto LAB_0011e89d;
          uVar23 = (uint)(jVar1 == json_array) << 3 | uVar23 & 0xfffffffa | 4;
          bVar5 = false;
          local_c0 = local_c0->parent;
        }
      }
    }
    else {
      if (bVar7 == 9) goto LAB_0011e124;
      if (uVar20 == 0x5d) {
        if ((local_c0 != (json_value *)0x0) && (local_c0->type == json_array)) {
LAB_0011dfa3:
          uVar24 = (uVar23 & 0xffffff72) + 1;
          bVar5 = true;
          goto LAB_0011e33d;
        }
        uStack_1b0 = local_138._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_138.cur_col;
        pcVar16 = "%d:%d: Unexpected ]";
        goto LAB_0011e8bf;
      }
      if ((uVar20 != 0xd) && (uVar20 != 0x20)) {
        if (uVar20 != 10) {
          if ((uVar23 & 4) != 0) {
            if (bVar7 != 0x2c) {
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Expected , before %c";
              goto LAB_0011e8bf;
            }
            uVar23 = uVar23 & 0xffffff7b;
            goto LAB_0011e124;
          }
          if ((uVar23 & 0x40) != 0) {
            if (bVar7 != 0x3a) {
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Expected : before %c";
              goto LAB_0011e8bf;
            }
            uVar23 = uVar23 & 0xffffff3b;
            goto LAB_0011e124;
          }
          uVar24 = uVar23 & 0xffffff33;
          if (bVar7 == 0x22) {
            iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,json_string);
            if (iVar11 != 0) {
              uVar23 = uVar24 | 0x20;
              local_198 = (_json_value *)(local_c0->u).object.values;
              uVar22 = 0;
              goto LAB_0011e124;
            }
          }
          else if (uVar20 == 0x5b) {
            iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,json_array);
joined_r0x0011e782:
            if (iVar11 != 0) goto LAB_0011e124;
          }
          else if (uVar20 == 0x66) {
            if (((((long)pbVar17 - (long)json < 4) ||
                 (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x61)) ||
                (local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x6c)) ||
               ((local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x73 ||
                (local_138.ptr = (char *)((byte *)json + 4), ((byte *)json)[4] != 0x65)))) {
LAB_0011eaad:
              uStack_1b0 = local_138._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_138.cur_col;
              pcVar16 = "%d:%d: Unknown value";
              goto LAB_0011e8bf;
            }
            jVar1 = json_boolean;
LAB_0011e68d:
            iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,jVar1);
            if (iVar11 != 0) {
LAB_0011e6a7:
              bVar5 = true;
              goto LAB_0011e33d;
            }
          }
          else {
            if (uVar20 == 0x6e) {
              if (((2 < (long)pbVar17 - (long)json) &&
                  (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] == 0x75)) &&
                 ((local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] == 0x6c &&
                  (local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] == 0x6c)))) {
                jVar1 = json_null;
                goto LAB_0011e68d;
              }
              goto LAB_0011eaad;
            }
            if (uVar20 == 0x74) {
              if (((((long)pbVar17 - (long)json < 3) ||
                   (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x72)) ||
                  (local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x75)) ||
                 (local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x65))
              goto LAB_0011eaad;
              iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,json_boolean);
              if (iVar11 != 0) {
                (local_c0->u).boolean = 1;
                goto LAB_0011e6a7;
              }
            }
            else {
              if (uVar20 == 0x7b) {
                iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,json_object);
                uVar23 = uVar24;
                goto joined_r0x0011e782;
              }
              ppuVar12 = __ctype_b_loc();
              if (((*(byte *)((long)*ppuVar12 + (long)(char)bVar7 * 2 + 1) & 8) == 0) &&
                 (bVar7 != 0x2d)) {
                uStack_1b0 = local_138._88_8_ & 0xffffffff;
                uVar18 = (ulong)local_138._88_8_ >> 0x20;
                pcVar16 = "%d:%d: Unexpected %c when seeking value";
                goto LAB_0011e8bf;
              }
              iVar11 = new_value(&local_138,&local_c0,&root,&local_d0,json_integer);
              if (iVar11 != 0) {
                if (local_138.first_pass != 0) {
                  if (bVar7 != 0x2d) {
                    uVar24 = uVar23 & 0xffffe033 | 2;
                    local_188 = 0;
                    local_170 = 0;
                    local_168 = 0;
                    goto LAB_0011e33d;
                  }
                  uVar23 = uVar23 & 0xffffe033 | 0x100;
                  local_188 = 0;
                  local_170 = 0;
                  local_168 = 0;
                  goto LAB_0011e124;
                }
                while (((((*ppuVar12)[(char)uVar20] >> 0xb & 1) != 0 ||
                        ((uVar20 - 0x2b < 0x3b &&
                         ((0x40000000400000dU >> ((ulong)(uVar20 - 0x2b) & 0x3f) & 1) != 0)))) &&
                       (local_138.ptr = local_138.ptr + 1, (byte *)local_138.ptr != pbVar17))) {
                  uVar20 = (uint)(byte)*local_138.ptr;
                }
                goto LAB_0011e339;
              }
            }
          }
          error[0x12] = 'f';
          error[0x13] = 'a';
          error[0x14] = 'i';
          error[0x15] = 'l';
          error[0x16] = 'u';
          error[0x17] = 'r';
          error[0x18] = 'e';
          error[0x19] = '\0';
          builtin_strncpy(error + 8,"llocation ",10);
          error[0] = 'M';
          error[1] = 'e';
          error[2] = 'm';
          error[3] = 'o';
          error[4] = 'r';
          error[5] = 'y';
          error[6] = ' ';
          error[7] = 'a';
LAB_0011e8cb:
          if (error_buf != (char *)0x0) {
            if (error[0] == '\0') {
              builtin_strncpy(error_buf,"Unknown error",0xe);
            }
            else {
              strcpy(error_buf,error);
            }
          }
          pjVar21 = local_d0;
          if (local_138.first_pass != 0) {
            local_d0 = root;
            pjVar21 = root;
          }
          while (pjVar21 != (json_value *)0x0) {
            p_Var19 = (pjVar21->_reserved).next_alloc;
            (*local_138.settings.mem_free)(pjVar21,local_138.settings.user_data);
            pjVar21 = p_Var19;
          }
          if (local_138.first_pass == 0) {
            json_value_free_ex(&local_138.settings,root);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            return (json_value *)0x0;
          }
          __stack_chk_fail();
        }
LAB_0011dc02:
        local_138.cur_col = 0;
        local_138.cur_line = local_138.cur_line + 1;
      }
    }
LAB_0011e124:
    json = local_138.ptr + 1;
  } while( true );
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value * top, * root, * alloc = 0;
   json_state state = { 0 };
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.mem_alloc)
      state.settings.mem_alloc = default_alloc;

   if (!state.settings.mem_free)
      state.settings.mem_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);
         
         if (flags & flag_string)
         {
            if (!b)
            {  sprintf (error, "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr <= 4 || 
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;
                        
                        if (end - state.ptr <= 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;
                        
                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }
                        
                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {  
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  sprintf (error, "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  sprintf (error, "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  sprintf (error, "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  sprintf (error, "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  sprintf (error, "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        sprintf (error, "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     { 
                        sprintf (error, "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  sprintf (error, "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:
               
               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  sprintf (error, "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;
                  
                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  sprintf (error, "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  sprintf (error, "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;
               
            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   sprintf (error, "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   sprintf (error, "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.mem_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}